

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O1

void testEncoding2<umu::r1>(void)

{
  Encoder *e_00;
  auto_ptr<avro::OutputStream> os;
  auto_ptr<avro::InputStream> is;
  EncoderPtr e;
  ValidSchema s;
  DecoderPtr d;
  r1 t1;
  r1 t2;
  ifstream ifs;
  long *local_2b0;
  long *local_2a8;
  Encoder *local_2a0;
  shared_count local_298;
  ValidSchema local_290 [8];
  shared_count local_288;
  Decoder *local_280;
  shared_count local_278;
  r1 local_270;
  r1 local_240;
  istream local_210 [520];
  
  avro::ValidSchema::ValidSchema(local_290);
  std::ifstream::ifstream(local_210,"jsonschemas/union_map_union",_S_in);
  avro::compileJsonSchema(local_210,local_290);
  avro::memoryOutputStream((ulong)&local_2b0);
  avro::binaryEncoder();
  avro::validatingEncoder((ValidSchema *)&local_2a0,(shared_ptr *)local_290);
  boost::detail::shared_count::~shared_count((shared_count *)&local_270.id._M_string_length);
  (**(code **)(*(long *)local_2a0 + 0x10))(local_2a0,local_2b0);
  umu::r1::r1(&local_270);
  e_00 = local_2a0;
  (**(code **)(*(long *)local_2a0 + 0x50))(local_2a0,&local_270);
  avro::encode<umu::_union_map_union_Union__1__>(e_00,&local_270.val);
  (**(code **)(*(long *)local_2a0 + 0x18))();
  avro::binaryDecoder();
  avro::validatingDecoder((ValidSchema *)&local_280,(shared_ptr *)local_290);
  boost::detail::shared_count::~shared_count((shared_count *)&local_240.id._M_string_length);
  avro::memoryInputStream((OutputStream *)&local_2a8);
  (**(code **)(*(long *)local_280 + 0x10))(local_280,local_2a8);
  umu::r1::r1(&local_240);
  avro::codec_traits<umu::r1>::decode(local_280,&local_240);
  if (local_240.val.value_.content != (placeholder *)0x0) {
    (*(local_240.val.value_.content)->_vptr_placeholder[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.id._M_dataplus._M_p != &local_240.id.field_2) {
    operator_delete(local_240.id._M_dataplus._M_p,local_240.id.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8 != (long *)0x0) {
    (**(code **)(*local_2a8 + 8))();
  }
  boost::detail::shared_count::~shared_count(&local_278);
  if (local_270.val.value_.content != (placeholder *)0x0) {
    (*(local_270.val.value_.content)->_vptr_placeholder[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.id._M_dataplus._M_p != &local_270.id.field_2) {
    operator_delete(local_270.id._M_dataplus._M_p,local_270.id.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_298);
  if (local_2b0 != (long *)0x0) {
    (**(code **)(*local_2b0 + 8))();
  }
  std::ifstream::~ifstream(local_210);
  boost::detail::shared_count::~shared_count(&local_288);
  return;
}

Assistant:

void testEncoding2()
{
    ValidSchema s;
    ifstream ifs(schemaFilename<T>::value);
    compileJsonSchema(ifs, s);

    auto_ptr<OutputStream> os = memoryOutputStream();
    EncoderPtr e = validatingEncoder(s, binaryEncoder());
    e->init(*os);
    T t1;
    setRecord(t1);
    avro::encode(*e, t1);
    e->flush();

    DecoderPtr d = validatingDecoder(s, binaryDecoder());
    auto_ptr<InputStream> is = memoryInputStream(*os);
    d->init(*is);
    T t2;
    avro::decode(*d, t2);

    check(t2, t1);
}